

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

void __thiscall md::Code::resolve_branches(Code *this)

{
  _Rb_tree_node_base *__args;
  pointer puVar1;
  _Rb_tree_color _Var2;
  iterator iVar3;
  const_iterator cVar4;
  mapped_type_conflict1 *pmVar5;
  _Base_ptr p_Var6;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint *puVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> branches_to_clean;
  uint32_t addr;
  uint *local_b8;
  iterator iStack_b0;
  uint *local_a8;
  string local_a0;
  _Base_ptr local_80;
  _Rb_tree_node_base *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = (uint *)0x0;
  iStack_b0._M_current = (uint *)0x0;
  local_a8 = (uint *)0x0;
  p_Var6 = (this->_pending_branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = &(this->_pending_branches)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_78) {
    local_80 = &(this->_labels)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(&(this->_labels)._M_t,(key_type *)&p_Var6[1]._M_parent);
      if (cVar4._M_node != local_80) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&this->_labels,(key_type *)&p_Var6[1]._M_parent);
        __args = p_Var6 + 1;
        _Var2 = __args->_M_color;
        iVar9 = *pmVar5 - _Var2;
        if (iVar9 - 0x8000U < 0xffff0001) {
          this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_70,__args->_M_color);
          std::operator+(&local_50,"Offset for branch at byte ",&local_70);
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50," is too big (cannot be expressed as word)");
          local_a0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
          paVar8 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == paVar8) {
            local_a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          }
          else {
            local_a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          local_a0._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          LandstalkerException::LandstalkerException(this_00,&local_a0);
          __cxa_throw(this_00,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        if ((int)(short)iVar9 - 0x80U < 0xffffff01) {
          local_a0._M_dataplus._M_p._0_1_ = (char)((uint)iVar9 >> 8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                    (&this->_bytes,
                     (const_iterator)
                     ((this->_bytes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + _Var2),(value_type_conflict *)&local_a0);
          local_a0._M_dataplus._M_p._0_1_ = (char)iVar9;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                    (&this->_bytes,
                     (const_iterator)
                     ((this->_bytes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + (ulong)__args->_M_color + 1),
                     (value_type_conflict *)&local_a0);
        }
        else {
          puVar1 = (this->_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((ulong)_Var2 - 1);
          *puVar1 = *puVar1 + (char)iVar9;
        }
        if (iStack_b0._M_current == local_a8) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b8,iStack_b0,
                     &__args->_M_color);
        }
        else {
          *iStack_b0._M_current = __args->_M_color;
          iStack_b0._M_current = iStack_b0._M_current + 1;
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_78);
  }
  iVar3._M_current = iStack_b0._M_current;
  if (local_b8 != iStack_b0._M_current) {
    puVar10 = local_b8;
    do {
      local_a0._M_dataplus._M_p._0_4_ = *puVar10;
      pVar11 = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&(this->_pending_branches)._M_t,(key_type_conflict3 *)&local_a0);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&(this->_pending_branches)._M_t,(_Base_ptr)pVar11.first._M_node,
                     (_Base_ptr)pVar11.second._M_node);
      puVar10 = puVar10 + 1;
    } while (puVar10 != iVar3._M_current);
  }
  if (local_b8 != (uint *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return;
}

Assistant:

void Code::resolve_branches()
{
    std::vector<uint32_t> branches_to_clean;

    for (auto& [branch_address, label] : _pending_branches)
    {
        if (_labels.count(label))
        {
            uint32_t label_address = _labels[label];
            int32_t offset = (int32_t)(label_address - branch_address);
            if(offset > 0x7FFF || offset < -0x7FFF)
            {
                throw LandstalkerException("Offset for branch at byte " + std::to_string(branch_address) +
                                           " is too big (cannot be expressed as word)");
            }

            int16_t truncated_offset = (int16_t)(label_address - branch_address);
            uint16_t truncated_offset_as_word = static_cast<uint16_t>(truncated_offset);
            if (truncated_offset > 0x7F || truncated_offset < -0x7F)
            {
                // Branch offset is more than one byte long, we need to add an optional displacement
                _bytes.insert(_bytes.begin() + branch_address, static_cast<uint8_t>(truncated_offset_as_word >> 8));
                _bytes.insert(_bytes.begin() + branch_address + 1, static_cast<uint8_t>(truncated_offset_as_word & 0x00FF));
            }
            else
            {
                // Branch offset is less than one byte long, we only need to increment opcode by the offset value
                _bytes[static_cast<size_t>(branch_address) - 1] += truncated_offset_as_word;
            }

            branches_to_clean.emplace_back(branch_address);
        }
    }

    for (uint32_t addr : branches_to_clean)
        _pending_branches.erase(addr);
}